

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
camp::EnumValueNotFound::EnumValueNotFound(EnumValueNotFound *this,long value,string *enumName)

{
  undefined1 local_a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *enumName_local;
  long value_local;
  EnumValueNotFound *this_local;
  
  local_20 = enumName;
  enumName_local = (string *)value;
  value_local = (long)this;
  Error::str<long>((Error *)local_a0,value);
  std::operator+(local_a0 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"the value ");
  std::operator+(local_60,local_a0 + 0x20);
  std::operator+(local_40,local_60);
  Error::Error(&this->super_Error,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)local_a0);
  *(undefined ***)&this->super_Error = &PTR__EnumValueNotFound_001fd4a8;
  return;
}

Assistant:

EnumValueNotFound::EnumValueNotFound(long value, const std::string& enumName)
    : Error("the value " + str(value) + " couldn't be found in metaenum " + enumName)
{
}